

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O3

void R_CheckDrawSegs(void)

{
  size_t sVar1;
  long lVar2;
  
  if (ds_p != drawsegs + MaxDrawSegs) {
    return;
  }
  sVar1 = 0x20;
  if (MaxDrawSegs != 0) {
    sVar1 = MaxDrawSegs * 2;
  }
  lVar2 = (long)firstdrawseg - (long)drawsegs;
  drawsegs = (drawseg_t *)
             M_Realloc_Dbg(drawsegs,sVar1 * 0x98,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_segs.cpp"
                           ,0x924);
  firstdrawseg = (drawseg_t *)(lVar2 + (long)drawsegs);
  ds_p = drawsegs + MaxDrawSegs;
  MaxDrawSegs = sVar1;
  DPrintf(3,"MaxDrawSegs increased to %zu\n",sVar1);
  return;
}

Assistant:

void R_CheckDrawSegs ()
{
	if (ds_p == &drawsegs[MaxDrawSegs])
	{ // [RH] Grab some more drawsegs
		size_t newdrawsegs = MaxDrawSegs ? MaxDrawSegs*2 : 32;
		ptrdiff_t firstofs = firstdrawseg - drawsegs;
		drawsegs = (drawseg_t *)M_Realloc (drawsegs, newdrawsegs * sizeof(drawseg_t));
		firstdrawseg = drawsegs + firstofs;
		ds_p = drawsegs + MaxDrawSegs;
		MaxDrawSegs = newdrawsegs;
		DPrintf (DMSG_NOTIFY, "MaxDrawSegs increased to %zu\n", MaxDrawSegs);
	}
}